

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddSubDirectoryCommand.cxx
# Opt level: O3

bool __thiscall
cmAddSubDirectoryCommand::InitialPass
          (cmAddSubDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  char *__s;
  size_t sVar7;
  char *pcVar8;
  ostream *poVar9;
  long lVar10;
  undefined8 *puVar11;
  bool excludeFromAll;
  undefined8 uVar12;
  ulong uVar13;
  pointer pbVar14;
  string srcPath;
  string srcArg;
  string binPath;
  string binArg;
  string error;
  string local_268;
  string local_248;
  long *local_228 [2];
  long local_218 [2];
  string local_208;
  char *local_1e8;
  long local_1e0;
  char local_1d8;
  undefined7 uStack_1d7;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar14) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    return false;
  }
  local_228[0] = local_218;
  pcVar3 = (pbVar14->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_228,pcVar3,pcVar3 + pbVar14->_M_string_length);
  local_1e8 = &local_1d8;
  local_1e0 = 0;
  local_1d8 = '\0';
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 1;
  if (pbVar14 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    excludeFromAll = false;
  }
  else {
    excludeFromAll = false;
    do {
      iVar6 = std::__cxx11::string::compare((char *)pbVar14);
      if (iVar6 == 0) {
        excludeFromAll = true;
      }
      else {
        if (local_1e0 != 0) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"called with incorrect number of arguments","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          bVar5 = false;
          goto LAB_00264b71;
        }
        std::__cxx11::string::_M_assign((string *)&local_1e8);
      }
      pbVar14 = pbVar14 + 1;
    } while (pbVar14 !=
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268._M_string_length = 0;
  local_268.field_2._M_local_buf[0] = '\0';
  bVar5 = cmsys::SystemTools::FileIsFullPath((char *)local_228[0]);
  if (bVar5) {
    std::__cxx11::string::_M_assign((string *)&local_268);
  }
  else {
    pcVar8 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    sVar4 = local_268._M_string_length;
    strlen(pcVar8);
    std::__cxx11::string::_M_replace((ulong)&local_268,0,(char *)sVar4,(ulong)pcVar8);
    std::__cxx11::string::append((char *)&local_268);
    std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_228[0]);
  }
  bVar5 = cmsys::SystemTools::FileIsDirectory(&local_268);
  if (!bVar5) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"given source \"","");
    std::__cxx11::string::_M_append(local_1a8,(ulong)local_228[0]);
    std::__cxx11::string::append(local_1a8);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    bVar5 = false;
    goto LAB_00264b56;
  }
  cmsys::SystemTools::CollapseFullPath((string *)local_1a8,&local_268);
  std::__cxx11::string::operator=((string *)&local_268,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_208._M_string_length = 0;
  local_208.field_2._M_local_buf[0] = '\0';
  if (local_1e0 == 0) {
    pcVar8 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)local_1a8,pcVar8,(allocator *)&local_248);
    bVar5 = cmsys::SystemTools::IsSubDirectory(&local_268,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (bVar5) {
      pcVar8 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      __s = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
      strlen(pcVar8);
      sVar7 = strlen(__s);
      if (sVar7 == 0) {
        lVar10 = 0;
      }
      else {
        lVar10 = sVar7 - (__s[sVar7 - 1] == '/');
      }
      paVar2 = &local_248.field_2;
      local_248._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,__s,__s + lVar10);
      std::__cxx11::string::substr((ulong)&local_1c8,(ulong)&local_268);
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar2) {
        uVar12 = local_248.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_1c0 + local_248._M_string_length) {
        uVar13 = 0xf;
        if (local_1c8 != local_1b8) {
          uVar13 = local_1b8[0];
        }
        if (uVar13 < local_1c0 + local_248._M_string_length) goto LAB_0026494e;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_1c8,0,(char *)0x0,(ulong)local_248._M_dataplus._M_p);
      }
      else {
LAB_0026494e:
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1c8)
        ;
      }
      psVar1 = puVar11 + 2;
      if ((size_type *)*puVar11 == psVar1) {
        local_1a8._16_8_ = *psVar1;
        local_1a8._24_8_ = puVar11[3];
        local_1a8._0_8_ = local_1a8 + 0x10;
      }
      else {
        local_1a8._16_8_ = *psVar1;
        local_1a8._0_8_ = (size_type *)*puVar11;
      }
      local_1a8._8_8_ = puVar11[1];
      *puVar11 = psVar1;
      puVar11[1] = 0;
      *(undefined1 *)psVar1 = 0;
      std::__cxx11::string::operator=((string *)&local_208,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00264ae0;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"not given a binary directory but the given source directory ",
               0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" is not a subdirectory of \"",0x1c)
    ;
    pcVar8 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)poVar9->_vptr_basic_ostream[-3]);
    }
    else {
      sVar7 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar8,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\".  ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"When specifying an out-of-tree source a binary directory ",0x39);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"must be explicitly specified.",0x1d);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar5 = false;
  }
  else {
    bVar5 = cmsys::SystemTools::FileIsFullPath(local_1e8);
    if (bVar5) {
      std::__cxx11::string::_M_assign((string *)&local_208);
    }
    else {
      pcVar8 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
      sVar4 = local_208._M_string_length;
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)&local_208,0,(char *)sVar4,(ulong)pcVar8);
      std::__cxx11::string::append((char *)&local_208);
      std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_1e8);
    }
LAB_00264ae0:
    cmsys::SystemTools::CollapseFullPath((string *)local_1a8,&local_208);
    std::__cxx11::string::operator=((string *)&local_208,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    bVar5 = true;
    cmMakefile::AddSubDirectory
              ((this->super_cmCommand).Makefile,&local_268,&local_208,excludeFromAll,true);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
LAB_00264b56:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
LAB_00264b71:
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
  }
  if (local_228[0] != local_218) {
    operator_delete(local_228[0],local_218[0] + 1);
  }
  return bVar5;
}

Assistant:

bool cmAddSubDirectoryCommand::InitialPass
(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // store the binpath
  std::string srcArg = args[0];
  std::string binArg;

  bool excludeFromAll = false;

  // process the rest of the arguments looking for optional args
  std::vector<std::string>::const_iterator i = args.begin();
  ++i;
  for(;i != args.end(); ++i)
    {
    if(*i == "EXCLUDE_FROM_ALL")
      {
      excludeFromAll = true;
      continue;
      }
    else if (binArg.empty())
      {
      binArg = *i;
      }
    else
      {
      this->SetError("called with incorrect number of arguments");
      return false;
      }
    }

  // Compute the full path to the specified source directory.
  // Interpret a relative path with respect to the current source directory.
  std::string srcPath;
  if(cmSystemTools::FileIsFullPath(srcArg.c_str()))
    {
    srcPath = srcArg;
    }
  else
    {
    srcPath = this->Makefile->GetCurrentSourceDirectory();
    srcPath += "/";
    srcPath += srcArg;
    }
  if(!cmSystemTools::FileIsDirectory(srcPath))
    {
    std::string error = "given source \"";
    error += srcArg;
    error += "\" which is not an existing directory.";
    this->SetError(error);
    return false;
    }
  srcPath = cmSystemTools::CollapseFullPath(srcPath);

  // Compute the full path to the binary directory.
  std::string binPath;
  if(binArg.empty())
    {
    // No binary directory was specified.  If the source directory is
    // not a subdirectory of the current directory then it is an
    // error.
    if(!cmSystemTools::IsSubDirectory(srcPath,
          this->Makefile->GetCurrentSourceDirectory()))
      {
      std::ostringstream e;
      e << "not given a binary directory but the given source directory "
        << "\"" << srcPath << "\" is not a subdirectory of \""
        << this->Makefile->GetCurrentSourceDirectory() << "\".  "
        << "When specifying an out-of-tree source a binary directory "
        << "must be explicitly specified.";
      this->SetError(e.str());
      return false;
      }

    // Remove the CurrentDirectory from the srcPath and replace it
    // with the CurrentOutputDirectory.
    const char* src = this->Makefile->GetCurrentSourceDirectory();
    const char* bin = this->Makefile->GetCurrentBinaryDirectory();
    size_t srcLen = strlen(src);
    size_t binLen = strlen(bin);
    if(srcLen > 0 && src[srcLen-1] == '/')
      { --srcLen; }
    if(binLen > 0 && bin[binLen-1] == '/')
      { --binLen; }
    binPath = std::string(bin, binLen) + srcPath.substr(srcLen);
    }
  else
    {
    // Use the binary directory specified.
    // Interpret a relative path with respect to the current binary directory.
    if(cmSystemTools::FileIsFullPath(binArg.c_str()))
      {
      binPath = binArg;
      }
    else
      {
      binPath = this->Makefile->GetCurrentBinaryDirectory();
      binPath += "/";
      binPath += binArg;
      }
    }
  binPath = cmSystemTools::CollapseFullPath(binPath);

  // Add the subdirectory using the computed full paths.
  this->Makefile->AddSubDirectory(srcPath, binPath,
                                  excludeFromAll, true);

  return true;
}